

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall
Catch::TestCaseTracking::TrackerBase::findChild(TrackerBase *this,string *name)

{
  bool bVar1;
  pointer this_00;
  ITracker *local_98;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_70 [3];
  TrackerHasName local_58;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_38;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_30;
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_28;
  __normal_iterator<const_Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_20;
  const_iterator it;
  string *name_local;
  TrackerBase *this_local;
  
  it._M_current = (Ptr<Catch::TestCaseTracking::ITracker> *)name;
  local_30._M_current =
       (Ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::begin(&this->m_children);
  local_38._M_current =
       (Ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::end(&this->m_children);
  TrackerHasName::TrackerHasName(&local_58,(string *)it._M_current);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>*,std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::TrackerBase::TrackerHasName>
                       (local_30,local_38,&local_58);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>const*,std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>>>>
  ::__normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>*>
            ((__normal_iterator<Catch::Ptr<Catch::TestCaseTracking::ITracker>const*,std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>>>>
              *)&local_20,&local_28);
  TrackerHasName::~TrackerHasName(&local_58);
  local_70[0]._M_current =
       (Ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::end(&this->m_children);
  bVar1 = __gnu_cxx::operator!=(&local_20,local_70);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>_>
              ::operator->(&local_20);
    local_98 = Ptr<Catch::TestCaseTracking::ITracker>::get(this_00);
  }
  else {
    local_98 = (ITracker *)0x0;
  }
  return local_98;
}

Assistant:

virtual ITracker* findChild( std::string const& name ) CATCH_OVERRIDE {
            Children::const_iterator it = std::find_if( m_children.begin(), m_children.end(), TrackerHasName( name ) );
            return( it != m_children.end() )
                ? it->get()
                : CATCH_NULL;
        }